

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O3

void __thiscall kj::_::LogExpectation::~LogExpectation(LogExpectation *this)

{
  bool bVar1;
  Fault f;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__LogExpectation_0062e7e8;
  bVar1 = UnwindDetector::isUnwinding(&this->unwindDetector);
  if ((!bVar1) && (this->seen == false)) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[30],kj::LogSeverity&,kj::StringPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/test-helpers.c++"
               ,0x32,FAILED,"seen","\"expected log message not seen\", severity, substring",
               (char (*) [30])"expected log message not seen",&this->severity,&this->substring);
    Debug::Fault::fatal(&f);
  }
  ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

LogExpectation::~LogExpectation() {
  if (!unwindDetector.isUnwinding()) {
    KJ_ASSERT(seen, "expected log message not seen", severity, substring);
  }
}